

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

MidiEvent * __thiscall smf::MidiFile::addCue(MidiFile *this,int aTrack,int aTick,string *text)

{
  MidiEvent *this_00;
  reference ppMVar1;
  MidiEvent *me;
  string *text_local;
  int aTick_local;
  int aTrack_local;
  MidiFile *this_local;
  
  this_00 = (MidiEvent *)operator_new(0x38);
  MidiEvent::MidiEvent(this_00);
  MidiMessage::makeCue((MidiMessage *)this_00,text);
  this_00->tick = aTick;
  ppMVar1 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                      (&this->m_events,(long)aTrack);
  MidiEventList::push_back_no_copy(*ppMVar1,this_00);
  return this_00;
}

Assistant:

MidiEvent* MidiFile::addCue(int aTrack, int aTick, const std::string& text) {
	MidiEvent* me = new MidiEvent;
	me->makeCue(text);
	me->tick = aTick;
	m_events[aTrack]->push_back_no_copy(me);
	return me;
}